

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
GetEndpoints(UA_Client *client,size_t *endpointDescriptionsSize,
            UA_EndpointDescription **endpointDescriptions)

{
  UA_Logger logger;
  char *pcVar1;
  undefined1 local_160 [4];
  UA_StatusCode retval;
  UA_GetEndpointsResponse response;
  UA_GetEndpointsRequest request;
  UA_EndpointDescription **endpointDescriptions_local;
  size_t *endpointDescriptionsSize_local;
  UA_Client *client_local;
  
  UA_GetEndpointsRequest_init((UA_GetEndpointsRequest *)&response.endpoints);
  UA_DateTime_now();
  UA_GetEndpointsResponse_init((UA_GetEndpointsResponse *)local_160);
  __UA_Client_Service(client,&response.endpoints,UA_TYPES + 0x6e,local_160,UA_TYPES + 0x9c);
  if (response.responseHeader.timestamp._4_4_ == 0) {
    *endpointDescriptions = (UA_EndpointDescription *)response.endpointsSize;
    *endpointDescriptionsSize =
         (size_t)response.responseHeader.additionalHeader.content.encoded.body.data;
    response.endpointsSize = 0;
    response.responseHeader.additionalHeader.content.encoded.body.data = (UA_Byte *)0x0;
    UA_GetEndpointsResponse_deleteMembers((UA_GetEndpointsResponse *)local_160);
    client_local._4_4_ = 0;
  }
  else {
    logger = (client->config).logger;
    pcVar1 = UA_StatusCode_name(response.responseHeader.timestamp._4_4_);
    UA_LOG_ERROR(logger,UA_LOGCATEGORY_CLIENT,"GetEndpointRequest failed with error code %s",pcVar1)
    ;
    UA_GetEndpointsResponse_deleteMembers((UA_GetEndpointsResponse *)local_160);
    client_local._4_4_ = response.responseHeader.timestamp._4_4_;
  }
  return client_local._4_4_;
}

Assistant:

static UA_StatusCode
GetEndpoints(UA_Client *client, size_t* endpointDescriptionsSize,
             UA_EndpointDescription** endpointDescriptions) {
    UA_GetEndpointsRequest request;
    UA_GetEndpointsRequest_init(&request);
    request.requestHeader.timestamp = UA_DateTime_now();
    request.requestHeader.timeoutHint = 10000;
    // assume the endpointurl outlives the service call
    request.endpointUrl = client->endpointUrl; 

    UA_GetEndpointsResponse response;
    UA_GetEndpointsResponse_init(&response);
    __UA_Client_Service(client, &request, &UA_TYPES[UA_TYPES_GETENDPOINTSREQUEST],
                        &response, &UA_TYPES[UA_TYPES_GETENDPOINTSRESPONSE]);

    if(response.responseHeader.serviceResult != UA_STATUSCODE_GOOD) {
        UA_StatusCode retval = response.responseHeader.serviceResult;
        UA_LOG_ERROR(client->config.logger, UA_LOGCATEGORY_CLIENT,
                     "GetEndpointRequest failed with error code %s",
                     UA_StatusCode_name(retval));
        UA_GetEndpointsResponse_deleteMembers(&response);
        return retval;
    }
    *endpointDescriptions = response.endpoints;
    *endpointDescriptionsSize = response.endpointsSize;
    response.endpoints = NULL;
    response.endpointsSize = 0;
    UA_GetEndpointsResponse_deleteMembers(&response);
    return UA_STATUSCODE_GOOD;
}